

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O2

REF_STATUS ref_edge_tec_fill(REF_EDGE ref_edge,char *filename)

{
  REF_STATUS RVar1;
  FILE *__s;
  long lVar2;
  
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x226,
           "ref_edge_tec_fill","unable to open file");
    RVar1 = 2;
  }
  else {
    fwrite("title=\"tecplot refine edge fill\"\n",0x21,1,__s);
    fwrite("variables = \"i\" \"j\"\n",0x14,1,__s);
    fprintf(__s,"zone t=\"fill\", i=%d, datapacking=%s\n",(ulong)(uint)(ref_edge->n * 2),"point");
    for (lVar2 = 0; lVar2 < ref_edge->n; lVar2 = lVar2 + 1) {
      fprintf(__s," %d %d\n",(ulong)(uint)ref_edge->e2n[lVar2 * 2],
              (ulong)(uint)ref_edge->e2n[lVar2 * 2 + 1]);
      fprintf(__s," %d %d\n",(ulong)(uint)ref_edge->e2n[lVar2 * 2 + 1],
              (ulong)(uint)ref_edge->e2n[lVar2 * 2]);
    }
    fclose(__s);
    RVar1 = 0;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_edge_tec_fill(REF_EDGE ref_edge, const char *filename) {
  REF_INT edge;

  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine edge fill\"\n");
  fprintf(file, "variables = \"i\" \"j\"\n");

  fprintf(file, "zone t=\"fill\", i=%d, datapacking=%s\n",
          2 * ref_edge_n(ref_edge), "point");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    fprintf(file, " %d %d\n", ref_edge_e2n(ref_edge, 0, edge),
            ref_edge_e2n(ref_edge, 1, edge));
    fprintf(file, " %d %d\n", ref_edge_e2n(ref_edge, 1, edge),
            ref_edge_e2n(ref_edge, 0, edge));
  }

  fclose(file);

  return REF_SUCCESS;
}